

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particles.c
# Opt level: O3

void tessellate_floor(float x1,float y1,float x2,float y2,int depth)

{
  int depth_00;
  float fVar1;
  float fVar2;
  
  if (depth < 5) {
    depth_00 = depth + 1;
    do {
      fVar1 = ABS(x1);
      if (ABS(x2) <= ABS(x1)) {
        fVar1 = ABS(x2);
      }
      fVar2 = ABS(y1);
      if (ABS(y2) <= ABS(y1)) {
        fVar2 = ABS(y2);
      }
      if (0.1 <= fVar1 * fVar1 + fVar2 * fVar2) break;
      fVar1 = (x1 + x2) * 0.5;
      fVar2 = (y1 + y2) * 0.5;
      tessellate_floor(x1,y1,fVar1,fVar2,depth_00);
      tessellate_floor(fVar1,y1,x2,fVar2,depth_00);
      tessellate_floor(x1,fVar2,fVar1,y2,depth_00);
      depth_00 = depth_00 + 1;
      x1 = fVar1;
      y1 = fVar2;
    } while (depth_00 != 6);
  }
  (*glad_glTexCoord2f)(x1 * 30.0,y1 * 30.0);
  (*glad_glVertex3f)(x1 * 80.0,y1 * 80.0,0.0);
  (*glad_glTexCoord2f)(x2 * 30.0,y1 * 30.0);
  (*glad_glVertex3f)(x2 * 80.0,y1 * 80.0,0.0);
  (*glad_glTexCoord2f)(x2 * 30.0,y2 * 30.0);
  (*glad_glVertex3f)(x2 * 80.0,y2 * 80.0,0.0);
  (*glad_glTexCoord2f)(x1 * 30.0,y2 * 30.0);
  (*glad_glVertex3f)(x1 * 80.0,y2 * 80.0,0.0);
  return;
}

Assistant:

static void tessellate_floor(float x1, float y1, float x2, float y2, int depth)
{
    float delta, x, y;

    // Last recursion?
    if (depth >= 5)
        delta = 999999.f;
    else
    {
        x = (float) (fabs(x1) < fabs(x2) ? fabs(x1) : fabs(x2));
        y = (float) (fabs(y1) < fabs(y2) ? fabs(y1) : fabs(y2));
        delta = x*x + y*y;
    }

    // Recurse further?
    if (delta < 0.1f)
    {
        x = (x1 + x2) * 0.5f;
        y = (y1 + y2) * 0.5f;
        tessellate_floor(x1, y1,  x,  y, depth + 1);
        tessellate_floor(x, y1, x2,  y, depth + 1);
        tessellate_floor(x1,  y,  x, y2, depth + 1);
        tessellate_floor(x,  y, x2, y2, depth + 1);
    }
    else
    {
        glTexCoord2f(x1 * 30.f, y1 * 30.f);
        glVertex3f(  x1 * 80.f, y1 * 80.f, 0.f);
        glTexCoord2f(x2 * 30.f, y1 * 30.f);
        glVertex3f(  x2 * 80.f, y1 * 80.f, 0.f);
        glTexCoord2f(x2 * 30.f, y2 * 30.f);
        glVertex3f(  x2 * 80.f, y2 * 80.f, 0.f);
        glTexCoord2f(x1 * 30.f, y2 * 30.f);
        glVertex3f(  x1 * 80.f, y2 * 80.f, 0.f);
    }
}